

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O1

bool check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
               (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *sa,string *str,comm *c)

{
  unsigned_long *data;
  int iVar1;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> gsa;
  int local_30;
  uint local_2c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  data = (sa->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  mxx::gatherv<unsigned_long>
            (&local_28,data,
             (long)(sa->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)data >> 3,0,c);
  local_2c = 1;
  if (c->m_rank == 0) {
    local_2c = 0;
    if ((long)local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 == str->_M_string_length) {
      iVar1 = sufcheck64((str->_M_dataplus)._M_p,
                         local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,str->_M_string_length,1);
      local_2c = (uint)(iVar1 == 0);
    }
  }
  MPI_Allreduce(&local_2c,&local_30,1,&ompi_mpi_int,&ompi_mpi_op_land,c->mpi_comm);
  if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return local_30 != 0;
}

Assistant:

bool check_sa_dss(suffix_array<Iterator, index_t, _LCP>& sa, const std::string& str, const mxx::comm& c) {
    // gather SA back to root process
    std::vector<index_t> gsa = mxx::gatherv(sa.local_SA, 0, c);

    // check correctness using dss
    bool dss_correct = true;
    if (c.rank() == 0) {
        dss_correct = dss::check(str.begin(), str.end(), gsa);
    }

    return mxx::all_of(dss_correct, c);

    // check correctness using own method
    // TODO return bool value instead of exit(FAILURE) in that function
    //bool correct = gl_check_correct(sa, local_str.begin(), local_str.end(), c);
}